

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_deserialize_list_element
          (t_cpp_generator *this,ostream *out,t_list *tlist,string *prefix,bool use_push,
          string *index)

{
  t_type *ptVar1;
  ostream *poVar2;
  undefined7 in_register_00000081;
  string elem;
  t_field felem;
  allocator local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  if ((int)CONCAT71(in_register_00000081,use_push) == 0) {
    ptVar1 = tlist->elem_type_;
    std::operator+(&local_1e0,prefix,"[");
    std::operator+(&local_200,&local_1e0,index);
    std::operator+(&local_180,&local_200,"]");
    t_field::t_field(&local_e0,ptVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::string((string *)&local_1a0,"",(allocator *)&local_200);
    std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)&local_1e0);
    generate_deserialize_field(this,out,&local_e0,&local_1a0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    t_field::~t_field(&local_e0);
  }
  else {
    std::__cxx11::string::string((string *)&local_100,"_elem",(allocator *)&local_e0);
    t_generator::tmp(&local_200,(t_generator *)this,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    ptVar1 = tlist->elem_type_;
    std::__cxx11::string::string((string *)&local_120,(string *)&local_200);
    t_field::t_field(&local_e0,ptVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    poVar2 = t_generator::indent((t_generator *)this,out);
    declare_field_abi_cxx11_(&local_1e0,this,&local_e0,false,false,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_1e0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::string((string *)&local_140,"",(allocator *)&local_1e0);
    std::__cxx11::string::string((string *)&local_160,"",&local_201);
    generate_deserialize_field(this,out,&local_e0,&local_140,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".push_back(");
    poVar2 = std::operator<<(poVar2,(string *)&local_200);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_field::~t_field(&local_e0);
    std::__cxx11::string::~string((string *)&local_200);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_list_element(ostream& out,
                                                        t_list* tlist,
                                                        string prefix,
                                                        bool use_push,
                                                        string index) {
  if (use_push) {
    string elem = tmp("_elem");
    t_field felem(tlist->get_elem_type(), elem);
    indent(out) << declare_field(&felem) << endl;
    generate_deserialize_field(out, &felem);
    indent(out) << prefix << ".push_back(" << elem << ");" << endl;
  } else {
    t_field felem(tlist->get_elem_type(), prefix + "[" + index + "]");
    generate_deserialize_field(out, &felem);
  }
}